

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool __thiscall MountPoint::parse(MountPoint *this,string *line)

{
  size_t sVar1;
  StringPiece input;
  StringPiece input_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  char *pcVar8;
  reference __last;
  vector<StringPiece,_std::allocator<StringPiece>_> local_120;
  allocator<StringPiece> local_101;
  vector<StringPiece,_std::allocator<StringPiece>_> local_100;
  char *local_e8;
  size_t sStack_e0;
  vector<StringPiece,_std::allocator<StringPiece>_> local_d8;
  string local_c0;
  string local_a0;
  StringPiece local_70;
  ulong local_60;
  size_t i;
  size_t optionalStart;
  StringPiece local_48;
  undefined1 local_38 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  string *line_local;
  MountPoint *this_local;
  
  pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)line;
  StringPiece::StringPiece(&local_48,line);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,local_48,' ');
  sVar5 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38);
  if (sVar5 < 10) {
    this_local._7_1_ = false;
  }
  else {
    i = 0;
    local_60 = 6;
    while( true ) {
      uVar2 = local_60;
      sVar5 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38);
      if (sVar5 <= uVar2) break;
      pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                         ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,local_60);
      StringPiece::StringPiece(&local_70,"-");
      bVar3 = StringPiece::operator==(pvVar6,&local_70);
      if (bVar3) {
        i = local_60 + 1;
        break;
      }
      local_60 = local_60 + 1;
    }
    if (i == 0) {
      this_local._7_1_ = false;
    }
    else {
      sVar5 = i + 3;
      sVar7 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38);
      if (sVar5 == sVar7) {
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,0);
        StringPiece::AsString_abi_cxx11_(&local_a0,pvVar6);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar4 = atoi(pcVar8);
        this->mountId = iVar4;
        std::__cxx11::string::~string((string *)&local_a0);
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,1);
        StringPiece::AsString_abi_cxx11_(&local_c0,pvVar6);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar4 = atoi(pcVar8);
        this->parentId = iVar4;
        std::__cxx11::string::~string((string *)&local_c0);
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,2);
        sVar1 = pvVar6->len_;
        (this->deviceId).str_ = pvVar6->str_;
        (this->deviceId).len_ = sVar1;
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,3);
        sVar1 = pvVar6->len_;
        (this->root).str_ = pvVar6->str_;
        (this->root).len_ = sVar1;
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,4);
        sVar1 = pvVar6->len_;
        (this->mountPoint).str_ = pvVar6->str_;
        (this->mountPoint).len_ = sVar1;
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,5);
        local_e8 = pvVar6->str_;
        sStack_e0 = pvVar6->len_;
        input.str_ = pvVar6->str_;
        input.len_ = pvVar6->len_;
        SplitStringPiece(&local_d8,input,',');
        std::vector<StringPiece,_std::allocator<StringPiece>_>::operator=(&this->options,&local_d8);
        std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector(&local_d8);
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,6);
        __last = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,i - 1);
        std::allocator<StringPiece>::allocator(&local_101);
        std::vector<StringPiece,std::allocator<StringPiece>>::vector<StringPiece*,void>
                  ((vector<StringPiece,std::allocator<StringPiece>> *)&local_100,pvVar6,__last,
                   &local_101);
        std::vector<StringPiece,_std::allocator<StringPiece>_>::operator=
                  (&this->optionalFields,&local_100);
        std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector(&local_100);
        std::allocator<StringPiece>::~allocator(&local_101);
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,i);
        sVar1 = pvVar6->len_;
        (this->fsType).str_ = pvVar6->str_;
        (this->fsType).len_ = sVar1;
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,i + 1);
        sVar1 = pvVar6->len_;
        (this->mountSource).str_ = pvVar6->str_;
        (this->mountSource).len_ = sVar1;
        pvVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38,i + 2);
        input_00.str_ = pvVar6->str_;
        input_00.len_ = pvVar6->len_;
        SplitStringPiece(&local_120,input_00,',');
        std::vector<StringPiece,_std::allocator<StringPiece>_>::operator=
                  (&this->superOptions,&local_120);
        std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector(&local_120);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  optionalStart._4_4_ = 1;
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool parse(const string& line) {
    vector<StringPiece> pieces = SplitStringPiece(line, ' ');
    if (pieces.size() < 10)
      return false;
    size_t optionalStart = 0;
    for (size_t i = 6; i < pieces.size(); i++) {
      if (pieces[i] == "-") {
        optionalStart = i + 1;
        break;
      }
    }
    if (optionalStart == 0)
      return false;
    if (optionalStart + 3 != pieces.size())
      return false;
    mountId = atoi(pieces[0].AsString().c_str());
    parentId = atoi(pieces[1].AsString().c_str());
    deviceId = pieces[2];
    root = pieces[3];
    mountPoint = pieces[4];
    options = SplitStringPiece(pieces[5], ',');
    optionalFields =
        vector<StringPiece>(&pieces[6], &pieces[optionalStart - 1]);
    fsType = pieces[optionalStart];
    mountSource = pieces[optionalStart + 1];
    superOptions = SplitStringPiece(pieces[optionalStart + 2], ',');
    return true;
  }